

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O0

void free_registrymanager_handle(IOTHUB_REGISTRYMANAGER *registryManager)

{
  IOTHUB_REGISTRYMANAGER *registryManager_local;
  
  free(registryManager->hostname);
  free(registryManager->iothubName);
  free(registryManager->iothubSuffix);
  free(registryManager->sharedAccessKey);
  free(registryManager->deviceId);
  free(registryManager);
  return;
}

Assistant:

static void free_registrymanager_handle(IOTHUB_REGISTRYMANAGER *registryManager)
{
    free(registryManager->hostname);
    free(registryManager->iothubName);
    free(registryManager->iothubSuffix);
    free(registryManager->sharedAccessKey);
    free(registryManager->deviceId);
    free(registryManager);
}